

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Save(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  char *format;
  int nCurEdges;
  int nCurLuts;
  int local_2c;
  int local_28;
  int local_24;
  
  Extra_UtilGetoptReset();
  iVar3 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar3 == -1) {
    pGVar4 = pAbc->pGia;
    if (pGVar4 == (Gia_Man_t *)0x0) {
      format = "Empty network.\n";
    }
    else {
      if (pGVar4->vMapping != (Vec_Int_t *)0x0) {
        pGVar2 = pAbc->pGiaBest;
        Gia_ManLutParams(pGVar4,&local_24,&local_28,&local_2c);
        if (pGVar2 != (Gia_Man_t *)0x0) {
          iVar3 = pGVar2->nRegs;
          iVar1 = pGVar4->nRegs;
          if ((((pGVar2->vCis->nSize - iVar3 == pGVar4->vCis->nSize - iVar1) && (iVar3 == iVar1)) &&
              (pGVar2->vCos->nSize - iVar3 == pGVar4->vCos->nSize - iVar1)) &&
             ((iVar3 = strcmp(pGVar2->pName,pGVar4->pName), iVar3 == 0 &&
              (pAbc->nBestLevels <= local_2c)))) {
            if (pAbc->nBestLevels != local_2c) {
              return 0;
            }
            if (pAbc->nBestLuts * 2 + pAbc->nBestEdges <= local_24 * 2 + local_28) {
              return 0;
            }
          }
        }
        pAbc->nBestLuts = local_24;
        pAbc->nBestEdges = local_28;
        pAbc->nBestLevels = local_2c;
        Gia_ManStopP(&pAbc->pGiaBest);
        pGVar4 = Gia_ManDupWithAttributes(pAbc->pGia);
        pAbc->pGiaBest = pGVar4;
        return 0;
      }
      format = "GIA has no mapping.\n";
    }
    iVar3 = -1;
  }
  else {
    Abc_Print(-2,"usage: &save [-h]\n");
    Abc_Print(-2,"\t        compares and possibly saves AIG with mapping\n");
    format = "\t-h    : print the command usage\n";
    iVar3 = -2;
  }
  Abc_Print(iVar3,format);
  return 1;
}

Assistant:

int Abc_CommandAbc9Save( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "GIA has no mapping.\n" );
        return 1;
    }
    if ( !Gia_ManCompareWithBest( pAbc->pGiaBest, pAbc->pGia, &pAbc->nBestLuts, &pAbc->nBestEdges, &pAbc->nBestLevels ) )
        return 0;
    // save the design as best
    Gia_ManStopP( &pAbc->pGiaBest );
    pAbc->pGiaBest = Gia_ManDupWithAttributes( pAbc->pGia );
    return 0; 

usage:
    Abc_Print( -2, "usage: &save [-h]\n" );
    Abc_Print( -2, "\t        compares and possibly saves AIG with mapping\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}